

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O1

REF_STATUS ref_layer_recover_face(REF_GRID ref_grid,REF_INT *face_nodes)

{
  int iVar1;
  int iVar2;
  REF_CELL pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  REF_BOOL complete;
  REF_DBL t;
  REF_DBL uvw [3];
  REF_INT local_90;
  int local_8c;
  long local_88;
  REF_INT *local_80;
  REF_GRID local_78;
  ulong local_70;
  long local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  REF_NODE local_38;
  
  pRVar3 = ref_grid->cell[8];
  lVar9 = (long)*face_nodes;
  local_90 = -1;
  local_70 = 0xffffffff;
  if (-1 < lVar9) {
    local_70 = 0xffffffff;
    if (*face_nodes < pRVar3->ref_adj->nnode) {
      local_70 = (ulong)(uint)pRVar3->ref_adj->first[lVar9];
    }
  }
  iVar6 = (int)local_70;
  if (iVar6 != -1) {
    local_90 = pRVar3->ref_adj->item[iVar6].ref;
  }
  local_38 = ref_grid->node;
  local_80 = face_nodes;
  local_78 = ref_grid;
  if (iVar6 != -1) {
    iVar6 = face_nodes[1];
    local_88 = lVar9;
    do {
      if (0 < pRVar3->node_per) {
        iVar10 = 0;
        local_68 = (long)local_90;
        do {
          if ((iVar6 == pRVar3->c2n[pRVar3->size_per * local_90 + iVar10]) && (0 < pRVar3->edge_per)
             ) {
            lVar8 = 0;
            do {
              lVar7 = pRVar3->size_per * local_68;
              iVar1 = pRVar3->c2n[pRVar3->e2n[lVar8 * 2] + lVar7];
              if ((((iVar1 != (int)lVar9) &&
                   (iVar2 = pRVar3->c2n[(long)(int)lVar7 + (long)pRVar3->e2n[lVar8 * 2 + 1]],
                   iVar2 != (int)lVar9)) && (iVar1 != iVar6)) && (iVar2 != iVar6)) {
                uVar5 = ref_node_tri_seg_intersection
                                  (local_38,iVar1,iVar2,local_80,&local_60,&local_58);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x382,"ref_layer_recover_face",(ulong)uVar5,"int");
                  return uVar5;
                }
                lVar9 = local_88;
                if (((0.0 < local_60) && (local_60 < 1.0)) &&
                   ((0.0 < local_58 && ((0.0 < local_50 && (0.0 < local_48)))))) {
                  printf("t %f u %f v %f w %f \n");
                  uVar5 = ref_layer_swap(local_78,iVar1,iVar2,*local_80,&local_8c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x386,"ref_layer_recover_face",(ulong)uVar5,"n0");
                    return uVar5;
                  }
                  lVar9 = local_88;
                  if (local_8c != 0) break;
                  uVar5 = ref_layer_swap(local_78,iVar1,iVar2,local_80[1],&local_8c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x389,"ref_layer_recover_face",(ulong)uVar5,"n1");
                    return uVar5;
                  }
                  lVar9 = local_88;
                  if (local_8c != 0) break;
                  uVar5 = ref_layer_swap(local_78,iVar1,iVar2,local_80[2],&local_8c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x38c,"ref_layer_recover_face",(ulong)uVar5,"n2");
                    return uVar5;
                  }
                  lVar9 = local_88;
                  if (local_8c != 0) break;
                  puts("nothing ");
                  lVar9 = local_88;
                }
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < pRVar3->edge_per);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < pRVar3->node_per);
      }
      pRVar4 = pRVar3->ref_adj->item;
      iVar10 = pRVar4[(int)local_70].next;
      local_70 = (ulong)iVar10;
      if (local_70 == 0xffffffffffffffff) {
        local_90 = -1;
      }
      else {
        local_90 = pRVar4[local_70].ref;
      }
    } while (iVar10 != -1);
  }
  lVar9 = (long)local_80[1];
  local_70 = 0xffffffff;
  if (-1 < lVar9) {
    local_70 = 0xffffffff;
    if (local_80[1] < pRVar3->ref_adj->nnode) {
      local_70 = (ulong)(uint)pRVar3->ref_adj->first[lVar9];
    }
  }
  if ((int)local_70 != -1) {
    local_90 = pRVar3->ref_adj->item[(int)local_70].ref;
    iVar6 = local_80[2];
    local_88 = lVar9;
    do {
      if (0 < pRVar3->node_per) {
        iVar10 = 0;
        local_68 = (long)local_90;
        do {
          if ((iVar6 == pRVar3->c2n[pRVar3->size_per * local_90 + iVar10]) && (0 < pRVar3->edge_per)
             ) {
            lVar8 = 0;
            do {
              lVar7 = pRVar3->size_per * local_68;
              iVar1 = pRVar3->c2n[pRVar3->e2n[lVar8 * 2] + lVar7];
              if ((((iVar1 != (int)lVar9) &&
                   (iVar2 = pRVar3->c2n[(long)(int)lVar7 + (long)pRVar3->e2n[lVar8 * 2 + 1]],
                   iVar2 != (int)lVar9)) && (iVar1 != iVar6)) && (iVar2 != iVar6)) {
                uVar5 = ref_node_tri_seg_intersection
                                  (local_38,iVar1,iVar2,local_80,&local_60,&local_58);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x39e,"ref_layer_recover_face",(ulong)uVar5,"int");
                  return uVar5;
                }
                lVar9 = local_88;
                if (((0.0 < local_60) && (local_60 < 1.0)) &&
                   ((0.0 < local_58 && ((0.0 < local_50 && (0.0 < local_48)))))) {
                  printf("t %f u %f v %f w %f \n");
                  uVar5 = ref_layer_swap(local_78,iVar1,iVar2,*local_80,&local_8c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3a2,"ref_layer_recover_face",(ulong)uVar5,"n0");
                    return uVar5;
                  }
                  lVar9 = local_88;
                  if (local_8c != 0) break;
                  uVar5 = ref_layer_swap(local_78,iVar1,iVar2,local_80[1],&local_8c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3a5,"ref_layer_recover_face",(ulong)uVar5,"n1");
                    return uVar5;
                  }
                  lVar9 = local_88;
                  if (local_8c != 0) break;
                  uVar5 = ref_layer_swap(local_78,iVar1,iVar2,local_80[2],&local_8c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3a8,"ref_layer_recover_face",(ulong)uVar5,"n2");
                    return uVar5;
                  }
                  lVar9 = local_88;
                  if (local_8c != 0) break;
                  puts("nothing ");
                  lVar9 = local_88;
                }
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < pRVar3->edge_per);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < pRVar3->node_per);
      }
      pRVar4 = pRVar3->ref_adj->item;
      iVar10 = pRVar4[(int)local_70].next;
      local_70 = (ulong)iVar10;
      if (local_70 == 0xffffffffffffffff) {
        local_90 = -1;
      }
      else {
        local_90 = pRVar4[local_70].ref;
      }
    } while (iVar10 != -1);
  }
  lVar9 = (long)local_80[2];
  local_70 = 0xffffffff;
  if (-1 < lVar9) {
    local_70 = 0xffffffff;
    if (local_80[2] < pRVar3->ref_adj->nnode) {
      local_70 = (ulong)(uint)pRVar3->ref_adj->first[lVar9];
    }
  }
  if ((int)local_70 != -1) {
    local_90 = pRVar3->ref_adj->item[(int)local_70].ref;
    iVar6 = *local_80;
    local_88 = lVar9;
    do {
      if (0 < pRVar3->node_per) {
        iVar10 = 0;
        local_68 = (long)local_90;
        do {
          if ((iVar6 == pRVar3->c2n[pRVar3->size_per * local_90 + iVar10]) && (0 < pRVar3->edge_per)
             ) {
            lVar8 = 0;
            do {
              lVar7 = pRVar3->size_per * local_68;
              iVar1 = pRVar3->c2n[pRVar3->e2n[lVar8 * 2] + lVar7];
              if ((((iVar1 != (int)lVar9) &&
                   (iVar2 = pRVar3->c2n[(long)(int)lVar7 + (long)pRVar3->e2n[lVar8 * 2 + 1]],
                   iVar2 != (int)lVar9)) && (iVar1 != iVar6)) && (iVar2 != iVar6)) {
                uVar5 = ref_node_tri_seg_intersection
                                  (local_38,iVar1,iVar2,local_80,&local_60,&local_58);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x3ba,"ref_layer_recover_face",(ulong)uVar5,"int");
                  return uVar5;
                }
                lVar9 = local_88;
                if (((0.0 < local_60) && (local_60 < 1.0)) &&
                   ((0.0 < local_58 && ((0.0 < local_50 && (0.0 < local_48)))))) {
                  printf("t %f u %f v %f w %f \n");
                  uVar5 = ref_layer_swap(local_78,iVar1,iVar2,*local_80,&local_8c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3be,"ref_layer_recover_face",(ulong)uVar5,"n0");
                    return uVar5;
                  }
                  lVar9 = local_88;
                  if (local_8c != 0) break;
                  uVar5 = ref_layer_swap(local_78,iVar1,iVar2,local_80[1],&local_8c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3c1,"ref_layer_recover_face",(ulong)uVar5,"n1");
                    return uVar5;
                  }
                  lVar9 = local_88;
                  if (local_8c != 0) break;
                  uVar5 = ref_layer_swap(local_78,iVar1,iVar2,local_80[2],&local_8c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3c4,"ref_layer_recover_face",(ulong)uVar5,"n2");
                    return uVar5;
                  }
                  lVar9 = local_88;
                  if (local_8c != 0) break;
                  puts("nothing ");
                  lVar9 = local_88;
                }
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < pRVar3->edge_per);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < pRVar3->node_per);
      }
      pRVar4 = pRVar3->ref_adj->item;
      iVar10 = pRVar4[(int)local_70].next;
      local_70 = (ulong)iVar10;
      if (local_70 == 0xffffffffffffffff) {
        local_90 = -1;
      }
      else {
        local_90 = pRVar4[local_70].ref;
      }
    } while (iVar10 != -1);
  }
  return 0;
}

Assistant:

static REF_FCN REF_STATUS ref_layer_recover_face(REF_GRID ref_grid,
                                                 REF_INT *face_nodes) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT face_node0, face_node1, item, cell_node, cell, cell_edge;
  REF_INT node0, node1;
  REF_DBL t, uvw[3];
  REF_BOOL complete;
  face_node0 = face_nodes[0];
  face_node1 = face_nodes[1];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  face_node0 = face_nodes[1];
  face_node1 = face_nodes[2];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  face_node0 = face_nodes[2];
  face_node1 = face_nodes[0];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  return REF_SUCCESS;
}